

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O1

int ctemplate_htmlparser::jsparser_buffer_last_identifier(jsparser_ctx *js,char *identifier)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  if (identifier == (char *)0x0) {
    __assert_fail("identifier != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                  ,0x14c,
                  "int ctemplate_htmlparser::jsparser_buffer_last_identifier(jsparser_ctx *, char *)"
                 );
  }
  iVar6 = js->buffer_end;
  iVar4 = iVar6 - js->buffer_start;
  iVar2 = (iVar6 + 0x12) - js->buffer_start;
  if (-1 < iVar4) {
    iVar2 = iVar4;
  }
  if (iVar2 < 1) {
    uVar5 = 0xffffffff;
  }
  else {
    uVar3 = (iVar6 + -1) % 0x12;
    uVar5 = uVar3 + 0x12;
    if (-1 < (int)uVar3) {
      uVar5 = uVar3;
    }
  }
  if ((int)uVar5 < 0) {
    bVar1 = 0;
  }
  else {
    bVar1 = js->buffer[uVar5];
  }
  uVar5 = 0xfffffffe;
  uVar3 = uVar5;
  if (((0x20 < bVar1) || ((0x100001e00U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) && (bVar1 != 0xa0)) {
    uVar5 = ~(uint)(bVar1 == 0xd);
    uVar3 = uVar5;
  }
  while (((bVar1 = jsparser_buffer_get(js,uVar5),
          0xf5 < (byte)(bVar1 - 0x3a) || 0xe5 < (byte)((bVar1 & 0xdf) + 0xa5) || (bVar1 == 0x5f)) ||
         (bVar1 == 0x24))) {
    uVar5 = uVar5 - 1;
  }
  iVar6 = uVar5 + 1;
  if ((int)uVar3 <= iVar6) {
    *identifier = '\0';
  }
  else {
    jsparser_buffer_slice(js,identifier,iVar6,uVar3);
  }
  return (uint)((int)uVar3 > iVar6);
}

Assistant:

int jsparser_buffer_last_identifier(jsparser_ctx *js, char *identifier)
{
  int end;
  int pos;

  assert(identifier != NULL);

  end = -1;
  /* Ignore the optional whitespace delimiter */
  if (js_is_whitespace(jsparser_buffer_get(js, -1))) {
    --end;
  }

  /* Find the beginning of the identifier. This loop ends either when we find a
   * character that doesn't belong to an identifier, or when we find a '\0'
   * character, which means we reached the end of the buffer. */
  for(pos = end; js_is_identifier(jsparser_buffer_get(js, pos)); --pos) {
  }
  if (pos + 1 >= end) {
    identifier[0] = '\0';
    return 0;
  }

  jsparser_buffer_slice(js, identifier, pos + 1, end);
  return 1;
}